

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

BinOpr subexpr(LexState *ls,expdesc *v,uint limit)

{
  uint uVar1;
  UnOpr limit_00;
  BinOpr BVar2;
  uint in_EDX;
  LexState *in_RSI;
  long in_RDI;
  BinOpr nextop;
  expdesc v2;
  UnOpr uop;
  BinOpr op;
  expdesc *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  BinOpr in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  BinOpr in_stack_ffffffffffffffcc;
  FuncState *in_stack_ffffffffffffffd0;
  UnOpr in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  enterlevel((LexState *)0x1154cc);
  limit_00 = getunopr(*(int *)(in_RDI + 0x10));
  if (limit_00 == OPR_NOUNOPR) {
    simpleexp((LexState *)in_stack_ffffffffffffffd0,
              (expdesc *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  else {
    luaX_next((LexState *)0x1154ee);
    subexpr(in_RSI,(expdesc *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),limit_00);
    luaK_prefix((FuncState *)CONCAT44(limit_00,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                (expdesc *)in_stack_ffffffffffffffd0);
  }
  BVar2 = getbinopr(*(int *)(in_RDI + 0x10));
  while( true ) {
    uVar1 = in_stack_ffffffffffffffc0 & 0xffffff;
    if (BVar2 != OPR_NOBINOPR) {
      uVar1 = CONCAT13(in_EDX < priority[BVar2].left,(int3)in_stack_ffffffffffffffc0);
    }
    in_stack_ffffffffffffffc0 = uVar1;
    if ((char)(in_stack_ffffffffffffffc0 >> 0x18) == '\0') break;
    luaX_next((LexState *)0x115578);
    luaK_infix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               (expdesc *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_stack_ffffffffffffffc4 = subexpr(in_RSI,(expdesc *)CONCAT44(in_EDX,BVar2),limit_00);
    luaK_posfix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                (expdesc *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffb8);
    BVar2 = in_stack_ffffffffffffffc4;
  }
  *(short *)(*(long *)(in_RDI + 0x38) + 0x60) = *(short *)(*(long *)(in_RDI + 0x38) + 0x60) + -1;
  return BVar2;
}

Assistant:

static BinOpr subexpr(LexState*ls,expdesc*v,unsigned int limit){
BinOpr op;
UnOpr uop;
enterlevel(ls);
uop=getunopr(ls->t.token);
if(uop!=OPR_NOUNOPR){
luaX_next(ls);
subexpr(ls,v,8);
luaK_prefix(ls->fs,uop,v);
}
else simpleexp(ls,v);
op=getbinopr(ls->t.token);
while(op!=OPR_NOBINOPR&&priority[op].left>limit){
expdesc v2;
BinOpr nextop;
luaX_next(ls);
luaK_infix(ls->fs,op,v);
nextop=subexpr(ls,&v2,priority[op].right);
luaK_posfix(ls->fs,op,v,&v2);
op=nextop;
}
leavelevel(ls);
return op;
}